

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint64_t farmhash_xo_h32(char *s,size_t len,uint64_t mul,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  long in_R8;
  uint64_t v;
  uint64_t u;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  
  uVar1 = fetch64(in_RDI);
  uVar2 = fetch64(in_RDI + 8);
  uVar3 = fetch64(in_RDI + in_RSI + -8);
  uVar4 = fetch64(in_RDI + in_RSI + -0x10);
  uVar5 = ror64(uVar1 * -0x4b6d499041670d8d + uVar2,0x2b);
  uVar6 = ror64(uVar3 * in_RDX,0x1e);
  uVar2 = ror64(uVar2 + 0x9ae16a3b2f90404f,0x12);
  uVar7 = uVar1 * -0x4b6d499041670d8d + uVar2 + uVar3 * in_RDX + in_R8;
  uVar1 = smix((uVar5 + uVar6 + uVar4 * -0x651e95c4d06fbfb1 + in_RCX ^ uVar7) * in_RDX);
  uVar1 = smix((uVar7 ^ uVar1) * in_RDX);
  return uVar1;
}

Assistant:

static inline uint64_t farmhash_xo_h32(const char *s, size_t len, uint64_t mul,
                           uint64_t seed0, uint64_t seed1) {
  uint64_t a = fetch64(s) * k1;
  uint64_t b = fetch64(s + 8);
  uint64_t c = fetch64(s + len - 8) * mul;
  uint64_t d = fetch64(s + len - 16) * k2;
  uint64_t u = ror64(a + b, 43) + ror64(c, 30) + d + seed0;
  uint64_t v = a + ror64(b + k2, 18) + c + seed1;
  a = smix((u ^ v) * mul);
  b = smix((v ^ a) * mul);
  return b;
}